

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_affects(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> *__a;
  long in_RDI;
  string buffer;
  int showdur;
  int i;
  AFFECT_DATA *paf;
  char buf [4608];
  AFFECT_DATA *paf_last;
  char *in_stack_ffffffffffffea48;
  allocator<char> *in_stack_ffffffffffffea50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea58;
  char **in_stack_ffffffffffffea60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea68;
  char **__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea80;
  char *in_stack_ffffffffffffea88;
  char *local_1570;
  char *local_1560;
  char *local_1550;
  char *local_1540;
  char *local_1530;
  char *local_1520;
  char *local_1510;
  char *local_1508;
  CHAR_DATA *local_1500;
  byte local_14f2;
  allocator<char> local_14f1;
  string local_14f0 [32];
  char *local_14d0;
  undefined1 local_14c8 [62];
  byte local_148a;
  undefined1 local_1489 [33];
  char *local_1468;
  allocator<char> *local_1460;
  char *local_1458;
  undefined8 local_1450;
  string local_1448 [32];
  int local_1428;
  int local_1424;
  undefined8 *local_1420;
  char local_1418 [184];
  format_args in_stack_ffffffffffffeca0;
  string_view in_stack_ffffffffffffecb0;
  undefined8 *local_210;
  undefined1 local_1f8 [48];
  undefined8 local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  undefined1 *local_1a8;
  char **local_1a0;
  allocator<char> **local_198;
  char *local_190;
  undefined8 uStack_188;
  string *local_180;
  char *local_178;
  char **local_170;
  undefined1 local_168 [64];
  undefined8 local_128;
  undefined1 *local_120;
  char *local_118;
  char **local_108;
  char **local_100;
  CHAR_DATA **local_f8;
  string *local_f0;
  char *local_e8;
  undefined1 auStack_e0 [24];
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char **local_a8;
  char **local_a0;
  char *local_98;
  undefined1 *local_88;
  undefined8 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  if ((*(long *)(in_RDI + 0x88) == 0) ||
     ((*(int *)(*(long *)(in_RDI + 0x88) + 0x38) == 5 && (**(long **)(in_RDI + 0x88) == 0)))) {
    send_to_char((char *)in_stack_ffffffffffffea50,(CHAR_DATA *)in_stack_ffffffffffffea48);
  }
  else {
    send_to_char((char *)in_stack_ffffffffffffea50,(CHAR_DATA *)in_stack_ffffffffffffea48);
    local_210 = (undefined8 *)0x0;
    for (local_1420 = *(undefined8 **)(in_RDI + 0x88); local_1420 != (undefined8 *)0x0;
        local_1420 = (undefined8 *)*local_1420) {
      if (*(int *)(local_1420 + 7) != 5) {
        for (local_1424 = 0; local_1424 < 0x1200; local_1424 = local_1424 + 1) {
          local_1418[local_1424] = '\0';
        }
        if (((local_210 == (undefined8 *)0x0) ||
            (*(short *)((long)local_1420 + 0x1c) != *(short *)((long)local_210 + 0x1c))) ||
           (((local_1420[2] != 0 || (local_210[2] != 0)) &&
            (bVar1 = str_cmp((char *)local_1420[2],(char *)local_210[2]), bVar1)))) {
          if (*(int *)(local_1420 + 7) == 1) {
            if (local_1420[2] == 0) {
              local_1520 = skill_table[*(short *)((long)local_1420 + 0x1c)].name;
            }
            else {
              local_1520 = (char *)local_1420[2];
            }
            sprintf(local_1418,"Skill  : %-17s",local_1520);
          }
          else if (*(int *)(local_1420 + 7) == 2) {
            if (local_1420[2] == 0) {
              local_1530 = skill_table[*(short *)((long)local_1420 + 0x1c)].name;
            }
            else {
              local_1530 = (char *)local_1420[2];
            }
            sprintf(local_1418,"Power  : %-17s",local_1530);
          }
          else if (*(int *)(local_1420 + 7) == 3) {
            if (local_1420[2] == 0) {
              local_1540 = skill_table[*(short *)((long)local_1420 + 0x1c)].name;
            }
            else {
              local_1540 = (char *)local_1420[2];
            }
            sprintf(local_1418,"Malady : %-17s",local_1540);
          }
          else if (*(int *)(local_1420 + 7) == 4) {
            if (local_1420[2] == 0) {
              local_1550 = skill_table[*(short *)((long)local_1420 + 0x1c)].name;
            }
            else {
              local_1550 = (char *)local_1420[2];
            }
            sprintf(local_1418,"Commune: %-17s",local_1550);
          }
          else if (*(int *)(local_1420 + 7) == 6) {
            if (local_1420[2] == 0) {
              local_1560 = skill_table[*(short *)((long)local_1420 + 0x1c)].name;
            }
            else {
              local_1560 = (char *)local_1420[2];
            }
            sprintf(local_1418,"Rune   : %-17s",local_1560);
          }
          else if (*(int *)(local_1420 + 7) == 7) {
            if (local_1420[2] == 0) {
              local_1570 = skill_table[*(short *)((long)local_1420 + 0x1c)].name;
            }
            else {
              local_1570 = (char *)local_1420[2];
            }
            sprintf(local_1418,"Timer  : %-17s",local_1570);
          }
          else if (*(int *)(local_1420 + 7) != 5) {
            in_stack_ffffffffffffea88 = local_1418;
            if (local_1420[2] == 0) {
              in_stack_ffffffffffffea80 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   skill_table[*(short *)((long)local_1420 + 0x1c)].name;
            }
            else {
              in_stack_ffffffffffffea80 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1420[2];
            }
            sprintf(in_stack_ffffffffffffea88,"Spell  : %-17s",in_stack_ffffffffffffea80);
          }
        }
        else {
          if (*(short *)(in_RDI + 0x138) < 0x14) goto LAB_0054c2fc;
          sprintf(local_1418,"                          ");
        }
        send_to_char((char *)in_stack_ffffffffffffea50,(CHAR_DATA *)in_stack_ffffffffffffea48);
        if (0x13 < *(short *)(in_RDI + 0x138)) {
          local_1428 = *(short *)(local_1420 + 4) + 1;
          __s = &local_1458;
          local_178 = "| modifies {}{}{} ";
          local_b0 = "| modifies {}{}{} ";
          local_1458 = "| modifies {}{}{} ";
          local_170 = __s;
          local_a8 = __s;
          pcVar2 = (char *)std::char_traits<char>::length((char_type *)0x54bb2b);
          __s[1] = pcVar2;
          local_58 = local_178;
          if (*(short *)((long)local_1420 + 0x26) < 0) {
            __a = (allocator<char> *)
                  affect_loc_name((int)((ulong)in_stack_ffffffffffffea48 >> 0x20));
          }
          else {
            __a = (allocator<char> *)mod_names[*(short *)((long)local_1420 + 0x26)].name;
          }
          local_1468 = " by ";
          if (-1 < *(short *)((long)local_1420 + 0x26)) {
            local_1468 = "";
          }
          local_148a = 0;
          local_1460 = __a;
          if (*(short *)((long)local_1420 + 0x26) < 0) {
            std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea88 >> 0x20));
          }
          else {
            in_stack_ffffffffffffea68 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1489;
            std::allocator<char>::allocator();
            local_148a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffea80,(char *)__s,__a);
          }
          local_180 = local_1448;
          local_190 = local_1458;
          uStack_188 = local_1450;
          local_198 = &local_1460;
          local_1a0 = &local_1468;
          local_1a8 = local_1489 + 1;
          local_a0 = &local_190;
          local_1b8 = local_1458;
          local_98 = local_1b8;
          fmt::v9::
          make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char_const*&,std::__cxx11::string&>
                    ((char **)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
                     in_stack_ffffffffffffea58);
          local_80 = &local_1c8;
          local_88 = local_1f8;
          local_68 = 0xdcc;
          local_1c8 = 0xdcc;
          local_78 = local_88;
          local_70 = local_88;
          local_60 = local_80;
          local_1c0 = local_88;
          fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca0);
          std::__cxx11::string::~string((string *)(local_1489 + 1));
          if ((local_148a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)local_1489);
          }
          if (*(int *)(local_1420 + 7) != 5) {
            std::__cxx11::string::c_str();
            send_to_char((char *)in_stack_ffffffffffffea50,(CHAR_DATA *)in_stack_ffffffffffffea48);
          }
          if (*(short *)(local_1420 + 4) == -1) {
            std::__cxx11::string::operator=(local_1448,"permanently");
          }
          else {
            local_c8 = &local_14d0;
            auStack_e0._16_8_ = "for%s%s%s hour%s.";
            local_c0 = "for%s%s%s hour%s.";
            local_14d0 = "for%s%s%s hour%s.";
            in_stack_ffffffffffffea58 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14c8;
            local_b8 = local_c8;
            in_stack_ffffffffffffea60 =
                 (char **)std::char_traits<char>::length((char_type *)0x54bf07);
            *(char ***)in_stack_ffffffffffffea58 = in_stack_ffffffffffffea60;
            local_8 = (char *)auStack_e0._16_8_;
            local_14f2 = 0;
            if (local_1428 == 1) {
              in_stack_ffffffffffffea50 = &local_14f1;
              std::allocator<char>::allocator();
              local_14f2 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffea80,(char *)__s,__a);
            }
            else {
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea88 >> 0x20));
            }
            if (local_1428 % 2 == 0) {
              in_stack_ffffffffffffea48 = "";
            }
            else {
              in_stack_ffffffffffffea48 = " and";
              if (local_1428 == 1) {
                in_stack_ffffffffffffea48 = "";
              }
            }
            local_1508 = " a half";
            if (local_1428 % 2 == 0) {
              local_1508 = "";
            }
            local_1510 = "s";
            if (local_1428 == 1 || local_1428 == 2) {
              local_1510 = "";
            }
            auStack_e0._8_8_ = local_14c8 + 8;
            local_e8 = local_14d0;
            auStack_e0._0_8_ = local_14c8._0_8_;
            local_f0 = local_14f0;
            local_f8 = &local_1500;
            local_100 = &local_1508;
            local_108 = &local_1510;
            local_50 = &local_e8;
            local_118 = local_14d0;
            local_1500 = (CHAR_DATA *)in_stack_ffffffffffffea48;
            local_48 = local_118;
            fmt::v9::
            make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,char_const*&,char_const*&,char_const*&>
                      (in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
                       (char **)in_stack_ffffffffffffea58,(char **)in_stack_ffffffffffffea50);
            local_30 = &local_128;
            local_38 = local_168;
            local_20 = 0xcccd;
            local_128 = 0xcccd;
            local_28 = local_38;
            local_18 = local_30;
            local_10 = local_38;
            local_120 = local_38;
            fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca0);
            std::__cxx11::string::operator=(local_1448,(string *)(local_14c8 + 8));
            std::__cxx11::string::~string((string *)(local_14c8 + 8));
            std::__cxx11::string::~string(local_14f0);
            if ((local_14f2 & 1) != 0) {
              std::allocator<char>::~allocator(&local_14f1);
            }
          }
          if (*(int *)(local_1420 + 7) != 5) {
            std::__cxx11::string::c_str();
            send_to_char((char *)in_stack_ffffffffffffea50,(CHAR_DATA *)in_stack_ffffffffffffea48);
          }
          std::__cxx11::string::~string(local_1448);
        }
        if (*(int *)(local_1420 + 7) != 5) {
          send_to_char((char *)in_stack_ffffffffffffea50,(CHAR_DATA *)in_stack_ffffffffffffea48);
        }
        local_210 = local_1420;
      }
LAB_0054c2fc:
    }
  }
  return;
}

Assistant:

void do_affects(CHAR_DATA *ch, char *argument)
{
	if (ch->affected == nullptr || !(ch->affected->aftype != AFT_INVIS || ch->affected->next != nullptr))
	{
		send_to_char("You are not affected by anything.\n\r", ch);
		return;
	}

	send_to_char("You are affected by:\n\r", ch);

	AFFECT_DATA *paf_last = nullptr;
	char buf[MAX_STRING_LENGTH];
	for (auto paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->aftype == AFT_INVIS)
			continue;

		for (auto i = 0; i < MAX_STRING_LENGTH; i++)
		{
			buf[i] = '\0';
		}

		if (paf_last != nullptr
			&& (paf->type == paf_last->type && ((paf->name == nullptr && paf_last->name == nullptr) || !str_cmp(paf->name, paf_last->name))))
		{
			if (ch->level >= 20)
				sprintf(buf, "                          ");
			else
				continue;
		}
		else
		{
			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_MALADY)
				sprintf(buf, "Malady : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_RUNE)
				sprintf(buf, "Rune   : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_TIMER)
				sprintf(buf, "Timer  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype != AFT_INVIS)
				sprintf(buf, "Spell  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
		}

		send_to_char(buf, ch);

		if (ch->level >= 20)
		{
			auto showdur = paf->duration + 1;

			auto buffer = fmt::format("| modifies {}{}{} ",
					(paf->mod_name > -1) ? mod_names[paf->mod_name].name : affect_loc_name(paf->location),
					(paf->mod_name > -1) ? "" : " by ",
					(paf->mod_name > -1) ? "" : std::to_string(paf->modifier)); //TODO: change the rest of the sprintf calls to format

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);

			if (paf->duration == -1)
			{
				buffer = "permanently";
			}
			else
			{
				buffer = fmt::format("for%s%s%s hour%s.",
					(showdur == 1) ? "" : std::to_string(showdur / 2),
					(showdur % 2 == 0) ? "" : (showdur == 1) ? "" : " and", (showdur % 2 == 0) ? "" : " a half",
					(showdur == 1 || showdur == 2) ? "" : "s");
			}

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);
		}

		if (paf->aftype != AFT_INVIS)
			send_to_char("\n\r", ch);

		paf_last = paf;
	}
}